

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::variable_statement::print(variable_statement *this,wostream *os)

{
  size_t i;
  ulong uVar1;
  pointer pdVar2;
  long lVar3;
  
  std::operator<<(os,"variable_statement{[");
  lVar3 = 0;
  for (uVar1 = 0;
      pdVar2 = (this->l_).super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar1 < (ulong)(((long)(this->l_).
                             super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar2) / 0x28);
      uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      std::operator<<(os,", ");
      pdVar2 = (this->l_).super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    mjs::operator<<(os,(declaration *)((long)&(pdVar2->id_)._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + 0x28;
  }
  std::operator<<(os,"]}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "variable_statement{[";
        for (size_t i = 0; i < l_.size(); ++i) {
            if (i) os << ", ";
            os << l_[i];
        }
        os << "]}";
    }